

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O0

int32_t __thiscall cab::calculate_costs(cab *this,node_type src,node_type dst)

{
  road_network *prVar1;
  bool bVar2;
  node_type nVar3;
  bool bVar4;
  node_type nVar5;
  pair<bool,_bool> pVar6;
  reference prVar7;
  uint local_a8;
  uint local_a4;
  uint32_t local_84;
  uint32_t local_54;
  undefined1 auStack_50 [3];
  bool is_inner;
  uint32_t cost;
  request r;
  iterator __end1;
  iterator __begin1;
  vector<request,_std::allocator<request>_> *__range1;
  uint32_t max;
  bool found_dst;
  bool found_src;
  pair<bool,_bool> pair;
  node_type dst_local;
  node_type src_local;
  cab *this_local;
  
  pVar6 = route_contains_ordered(this,src,dst);
  if ((((ushort)pVar6 & 1) == 0) || (((ushort)pVar6 & 0x100) == 0)) {
    __range1._4_4_ = 0;
    __end1 = std::vector<request,_std::allocator<request>_>::begin(&this->_requests);
    r._8_8_ = std::vector<request,_std::allocator<request>_>::end(&this->_requests);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<request_*,_std::vector<request,_std::allocator<request>_>_>
                                       *)&r._detours), bVar2) {
      prVar7 = __gnu_cxx::
               __normal_iterator<request_*,_std::vector<request,_std::allocator<request>_>_>::
               operator*(&__end1);
      auStack_50[0] = prVar7->_src;
      auStack_50[1] = prVar7->_dst;
      unique0x00012002 = *(undefined2 *)&prVar7->field_0x2;
      unique0x00012004 = prVar7->_passengers;
      r._0_8_ = *(undefined8 *)&prVar7->_detours;
      local_54 = request::detours((request *)auStack_50);
      bVar2 = road_network::is_inner(this->_rnet,src);
      if (((ushort)pVar6 & 1) == 0) {
        prVar1 = this->_rnet;
        nVar5 = this->_position;
        nVar3 = request::src((request *)auStack_50);
        bVar4 = road_network::in_between(prVar1,nVar5,nVar3,src);
        if (!bVar4) {
          prVar1 = this->_rnet;
          nVar5 = request::src((request *)auStack_50);
          nVar3 = request::dst((request *)auStack_50);
          bVar4 = road_network::in_between(prVar1,nVar5,nVar3,src);
          if (!bVar4) goto LAB_001e111b;
        }
        if (bVar2) {
          local_84 = local_54 + 1;
        }
        else {
          local_84 = local_54 + 2;
        }
        local_54 = local_84;
      }
LAB_001e111b:
      bVar2 = road_network::is_inner(this->_rnet,dst);
      if (((ushort)pVar6 & 0x100) == 0) {
        prVar1 = this->_rnet;
        nVar5 = this->_position;
        nVar3 = request::src((request *)auStack_50);
        bVar4 = road_network::in_between(prVar1,nVar5,nVar3,dst);
        if (!bVar4) {
          prVar1 = this->_rnet;
          nVar5 = request::src((request *)auStack_50);
          nVar3 = request::dst((request *)auStack_50);
          bVar4 = road_network::in_between(prVar1,nVar5,nVar3,dst);
          if (!bVar4) goto LAB_001e11e8;
        }
        if (bVar2) {
          local_a4 = local_54 + 1;
        }
        else {
          local_a4 = local_54 + 2;
        }
        local_54 = local_a4;
      }
LAB_001e11e8:
      if (__range1._4_4_ < local_54) {
        local_a8 = local_54;
      }
      else {
        local_a8 = __range1._4_4_;
      }
      __range1._4_4_ = local_a8;
      __gnu_cxx::__normal_iterator<request_*,_std::vector<request,_std::allocator<request>_>_>::
      operator++(&__end1);
    }
    this_local._4_4_ = __range1._4_4_;
  }
  else {
    this_local._4_4_ = this->_costs;
  }
  return this_local._4_4_;
}

Assistant:

std::int32_t cab::calculate_costs(node_type src, node_type dst)
{
    // check if the cab already has src and dst in that order in its requests
    std::pair<bool, bool> pair = route_contains_ordered(src, dst);
    bool found_src = pair.first;
    bool found_dst = pair.second;

    if(found_src && found_dst)
    {
        return _costs;
    }

    // calculate and return max detour costs
    std::uint32_t max = 0;
    for(auto r : _requests)
    {
        std::uint32_t cost = r.detours();
        bool is_inner = _rnet->is_inner(src); 
        // if cab stops at src before r.src() add 1 to r.detours() if src is on a inner edge
        // add 2 to r.detours() if src is on a outer edge
        // this accounts for the longer drive
        if(!found_src && (_rnet->in_between(_position, r.src(), src) || 
                _rnet->in_between(r.src(), r.dst(), src)))
        {
            cost = is_inner ? cost + 1 : cost + 2;
        }

        is_inner = _rnet->is_inner(dst); 
        // same as above but with dst
        if(!found_dst && (_rnet->in_between(_position, r.src(), dst) || 
                _rnet->in_between(r.src(), r.dst(), dst)))
        {
            cost = is_inner ? cost + 1 : cost + 2;
        }
        
        max = cost > max ? cost : max;
    }

    return max;
}